

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  MatchProperties match_properties;
  ostringstream e;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (fromFile->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"INSTALL encountered an empty string input file name.",0x34);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    bVar2 = true;
    if (((ulong)match_properties & 1) == 0) {
      bVar1 = cmsys::SystemTools::SameFile(fromFile,toFile);
      if (!bVar1) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(fromFile);
        if (bVar2) {
          bVar2 = InstallSymlink(this,fromFile,toFile);
          return bVar2;
        }
        bVar2 = cmsys::SystemTools::FileIsDirectory(fromFile);
        if (bVar2) {
          bVar2 = InstallDirectory(this,fromFile,toFile,match_properties);
          return bVar2;
        }
        bVar2 = cmsys::SystemTools::FileExists(fromFile);
        if (bVar2) {
          bVar2 = InstallFile(this,fromFile,toFile,match_properties);
          return bVar2;
        }
        iVar3 = (*this->_vptr_cmFileCopier[5])(this,fromFile);
        return SUB41(iVar3,0);
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }
  if (cmSystemTools::FileIsSymlink(fromFile)) {
    return this->InstallSymlink(fromFile, toFile);
  }
  if (cmSystemTools::FileIsDirectory(fromFile)) {
    return this->InstallDirectory(fromFile, toFile, match_properties);
  }
  if (cmSystemTools::FileExists(fromFile)) {
    return this->InstallFile(fromFile, toFile, match_properties);
  }
  return this->ReportMissing(fromFile);
}